

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

void Sim_UtilInfoFlip(Sim_Man_t *p,Abc_Obj_t *pNode)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  if (0 < p->nSimWords) {
    pvVar1 = p->vSim0->pArray[pNode->Id];
    pvVar2 = p->vSim1->pArray[pNode->Id];
    lVar3 = 0;
    do {
      *(uint *)((long)pvVar2 + lVar3 * 4) = ~*(uint *)((long)pvVar1 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nSimWords);
  }
  return;
}

Assistant:

void Sim_UtilInfoFlip( Sim_Man_t * p, Abc_Obj_t * pNode )
{
    unsigned * pSimInfo1, * pSimInfo2;
    int k;
    pSimInfo1 = (unsigned *)p->vSim0->pArray[pNode->Id];
    pSimInfo2 = (unsigned *)p->vSim1->pArray[pNode->Id];
    for ( k = 0; k < p->nSimWords; k++ )
        pSimInfo2[k] = ~pSimInfo1[k];
}